

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_node.c
# Opt level: O1

void signal_node_msg(signal_node_t *node,uint msg)

{
  if (node == (signal_node_t *)0x0) {
    signal_node_msg_cold_1();
  }
  else {
    if (msg == 1) {
      node->run = 1;
      sem_post((sem_t *)&node->sem);
      return;
    }
    if (msg == 0) {
      node->run = 0;
      return;
    }
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/signal_node.c"
                ,0xed,"0 == \"Bad signal_node_t message.\"");
}

Assistant:

void signal_node_msg(signal_node_t *node, unsigned int msg)
{
    CILK_ASSERT(node);
    switch (msg) {
    case 0:                    // worker should go to sleep.
        node->run = msg;
        break;
    case 1:                    // worker should be awake.
        node->run = msg;
        signal_cilk_semaphore(&node->sem);
        break;
    default:                   // error.
        CILK_ASSERT(0 == "Bad signal_node_t message.");
    }
}